

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall OpenMD::EAM::calcDensity(EAM *this,InteractionData *idat)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RSI;
  EAM *in_RDI;
  RealType RVar4;
  RealType *in_stack_00000008;
  CubicSpline *in_stack_00000010;
  RealType s;
  EAMAtomData *data2;
  EAMAtomData *data1;
  EAM *in_stack_00000300;
  double local_28;
  
  if ((in_RDI->initialized_ & 1U) == 0) {
    initialize(in_stack_00000300);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->EAMtids,(long)*in_RSI);
  pvVar2 = std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
                     (&in_RDI->EAMdata,(long)*pvVar1);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->EAMtids,(long)in_RSI[1]);
  pvVar3 = std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
                     (&in_RDI->EAMdata,(long)*pvVar1);
  if (((in_RDI->haveCutoffRadius_ & 1U) == 0) ||
     (*(double *)(in_RSI + 8) < in_RDI->eamRcut_ || *(double *)(in_RSI + 8) == in_RDI->eamRcut_)) {
    if (*(double *)(in_RSI + 8) < pvVar2->rcut) {
      local_28 = 1.0;
      if ((pvVar2->isFluctuatingCharge & 1U) != 0) {
        if (in_RDI->mixMeth_ == eamDream2) {
          local_28 = gFunc(in_RDI,*(RealType *)(in_RSI + 0xbc),pvVar2->nValence,pvVar2->nMobile);
        }
        else {
          local_28 = (pvVar2->nValence - *(double *)(in_RSI + 0xbc)) / pvVar2->nValence;
        }
      }
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3cc606);
      RVar4 = CubicSpline::getValueAt(in_stack_00000010,in_stack_00000008);
      *(double *)(in_RSI + 0xb2) = local_28 * RVar4 + *(double *)(in_RSI + 0xb2);
    }
    if (*(double *)(in_RSI + 8) < pvVar3->rcut) {
      local_28 = 1.0;
      if ((pvVar3->isFluctuatingCharge & 1U) != 0) {
        if (in_RDI->mixMeth_ == eamDream2) {
          local_28 = gFunc(in_RDI,*(RealType *)(in_RSI + 0xbe),pvVar3->nValence,pvVar3->nMobile);
        }
        else {
          local_28 = (pvVar3->nValence - *(double *)(in_RSI + 0xbe)) / pvVar3->nValence;
        }
      }
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3cc6f4);
      RVar4 = CubicSpline::getValueAt(in_stack_00000010,in_stack_00000008);
      *(double *)(in_RSI + 0xb0) = local_28 * RVar4 + *(double *)(in_RSI + 0xb0);
    }
  }
  return;
}

Assistant:

void EAM::calcDensity(InteractionData& idat) {
    if (!initialized_) initialize();

    EAMAtomData& data1 = EAMdata[EAMtids[idat.atid1]];
    EAMAtomData& data2 = EAMdata[EAMtids[idat.atid2]];
    RealType s;

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    if (idat.rij < data1.rcut) {
      s = 1.0;
      if (data1.isFluctuatingCharge) {
        if (mixMeth_ == eamDream2)
          s = gFunc(idat.flucQ1, data1.nValence, data1.nMobile);
        else
          s = (data1.nValence - idat.flucQ1) / (data1.nValence);
      }
      idat.rho2 += s * data1.rho->getValueAt(idat.rij);
    }

    if (idat.rij < data2.rcut) {
      s = 1.0;
      if (data2.isFluctuatingCharge) {
        if (mixMeth_ == eamDream2)
          s = gFunc(idat.flucQ2, data2.nValence, data2.nMobile);
        else
          s = (data2.nValence - idat.flucQ2) / (data2.nValence);
      }
      idat.rho1 += s * data2.rho->getValueAt(idat.rij);
    }

    return;
  }